

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O2

BOOL VIRTUALSetAllocState(UINT nAction,SIZE_T nStartingBit,SIZE_T nNumberOfBits,PCMI pInformation)

{
  BYTE *pBVar1;
  byte bVar2;
  BOOL BVar3;
  int __c;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  BVar3 = 0x18bdcc;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if ((pInformation != (PCMI)0x0) && (nNumberOfBits != 0)) {
    pBVar1 = pInformation->pAllocState;
    uVar6 = (nStartingBit + nNumberOfBits) - 1;
    uVar4 = nStartingBit >> 3;
    uVar7 = uVar6 >> 3;
    uVar5 = (uint)uVar6;
    if ((nStartingBit & 7) != 0) {
      bVar2 = *(byte *)((long)&VIRTUALSetPageBits(unsigned_int,unsigned_long,unsigned_long,unsigned_char*)
                               ::startmasks + (nStartingBit & 7));
      if (uVar7 == uVar4) {
        bVar2 = bVar2 & *(byte *)((long)&VIRTUALSetPageBits(unsigned_int,unsigned_long,unsigned_long,unsigned_char*)
                                         ::endmasks + (ulong)(uVar5 & 7));
      }
      if (nAction == 0x1000) {
        pBVar1[uVar4] = pBVar1[uVar4] | bVar2;
      }
      else {
        bVar2 = ~bVar2;
        pBVar1[uVar4] = pBVar1[uVar4] & bVar2;
      }
      if (uVar7 == uVar4) {
        return (BOOL)CONCAT71(0x16c0,bVar2);
      }
      uVar4 = uVar4 + 1;
    }
    if (uVar7 - uVar4 != 0) {
      __c = 0xff;
      if (nAction != 0x1000) {
        __c = 0;
      }
      memset(pBVar1 + uVar4,__c,uVar7 - uVar4);
    }
    bVar2 = *(byte *)((long)&VIRTUALSetPageBits(unsigned_int,unsigned_long,unsigned_long,unsigned_char*)
                             ::endmasks + (ulong)(uVar5 & 7));
    BVar3 = (BOOL)CONCAT71(0x16c0,bVar2);
    if (nAction == 0x1000) {
      pBVar1[uVar7] = pBVar1[uVar7] | bVar2;
    }
    else {
      BVar3 = (BOOL)CONCAT71(0x16c0,~bVar2);
      pBVar1[uVar7] = pBVar1[uVar7] & ~bVar2;
    }
  }
  return BVar3;
}

Assistant:

static BOOL VIRTUALSetAllocState( UINT nAction, SIZE_T nStartingBit,
                           SIZE_T nNumberOfBits, CONST PCMI pInformation )
{
    TRACE( "VIRTUALSetAllocState( nAction = %d, nStartingBit = %d, "
           "nNumberOfBits = %d, pStateArray = 0x%p )\n",
           nAction, nStartingBit, nNumberOfBits, pInformation );

    if ( !pInformation )
    {
        ERROR( "pInformation was invalid!\n" );
        return FALSE;
    }

    return VIRTUALSetPageBits((MEM_COMMIT == nAction) ? 1 : 0, nStartingBit,
                              nNumberOfBits, pInformation->pAllocState);
}